

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_endian.c
# Opt level: O3

void test_convert_htole32(void)

{
  uint32_t check;
  uint32_t check_pattern;
  uint32_t local_10 [2];
  
  local_10[1] = 0x78563412;
  local_10[0] = cio_htole32(0x78563412);
  UnityAssertEqualMemory
            (local_10 + 1,local_10,4,1,"32 bit little endian conversion incorrect!",0x9c,
             UNITY_ARRAY_TO_ARRAY);
  return;
}

Assistant:

static void test_convert_htole32(void)
{
	uint8_t pattern_array[] = {0x12, 0x34, 0x56, 0x78};
	uint32_t pattern;
	memcpy(&pattern, pattern_array, sizeof(pattern));
	uint32_t check_pattern = 0x78563412;

	uint32_t check = cio_htole32(pattern);

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(&check_pattern, &check, sizeof(check), "32 bit little endian conversion incorrect!");
}